

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O1

JSON JSON::parse(InputSource *is,Reactor *reactor)

{
  void *pvVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  void *pvVar3;
  JSON JVar4;
  JSONParser jp;
  undefined1 local_40c4 [16388];
  undefined8 local_c0;
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 uStack_a8;
  undefined7 uStack_a7;
  undefined1 uStack_a0;
  undefined8 uStack_9f;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  undefined8 local_70;
  undefined4 local_68;
  void *local_60;
  void *pvStack_58;
  long local_50;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  undefined8 local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  local_b8 = local_40c4;
  local_c0 = 0;
  local_b0 = 0;
  uStack_a8 = 0;
  uStack_a7 = 0;
  uStack_a0 = 0;
  uStack_9f = 0;
  local_88 = 0;
  local_80 = 0;
  local_70 = 0;
  local_68 = 0;
  local_60 = (void *)0x0;
  pvStack_58 = (void *)0x0;
  local_50 = 0;
  local_40 = 0;
  local_38 = 0;
  local_28 = 0;
  local_90 = &local_80;
  local_48 = &local_38;
  JVar4 = anon_unknown.dwarf_52375::JSONParser::parse((JSONParser *)is);
  _Var2._M_pi = JVar4.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  pvVar3 = local_60;
  pvVar1 = pvStack_58;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
    _Var2._M_pi = extraout_RDX;
    pvVar3 = local_60;
    pvVar1 = pvStack_58;
  }
  for (; pvVar3 != pvVar1; pvVar3 = (void *)((long)pvVar3 + 0x18)) {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pvVar3 + 0x10) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pvVar3 + 0x10));
      _Var2._M_pi = extraout_RDX_00;
    }
  }
  if (local_60 != (void *)0x0) {
    operator_delete(local_60,local_50 - (long)local_60);
    _Var2._M_pi = extraout_RDX_01;
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
    _Var2._M_pi = extraout_RDX_02;
  }
  JVar4.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  JVar4.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)is;
  return (JSON)JVar4.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSON
JSON::parse(InputSource& is, Reactor* reactor)
{
    JSONParser jp(is, reactor);
    return jp.parse();
}